

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.cpp
# Opt level: O3

bool duckdb::WindowExpression::Equal(WindowExpression *a,WindowExpression *b)

{
  vector<duckdb::OrderByNode,_true> *pvVar1;
  OrderType OVar2;
  OrderByNullType OVar3;
  pointer pOVar4;
  pointer pOVar5;
  bool bVar6;
  int iVar7;
  const_reference pvVar8;
  pointer pPVar9;
  type pPVar10;
  size_type sVar11;
  vector<duckdb::OrderByNode,_true> *pvVar12;
  
  if ((((((a->ignore_nulls == b->ignore_nulls) && (a->distinct == b->distinct)) &&
        (bVar6 = ParsedExpression::ListEquals(&a->children,&b->children), bVar6)) &&
       ((a->start == b->start && (a->end == b->end)))) &&
      ((a->exclude_clause == b->exclude_clause &&
       ((bVar6 = ParsedExpression::Equals(&a->start_expr,&b->start_expr), bVar6 &&
        (bVar6 = ParsedExpression::Equals(&a->end_expr,&b->end_expr), bVar6)))))) &&
     ((bVar6 = ParsedExpression::Equals(&a->offset_expr,&b->offset_expr), bVar6 &&
      (bVar6 = ParsedExpression::Equals(&a->default_expr,&b->default_expr), bVar6)))) {
    pOVar4 = (a->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
             .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pOVar5 = (a->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
             .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pOVar5 - (long)pOVar4 ==
        (long)(b->arg_orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(b->arg_orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start) {
      if (pOVar5 != pOVar4) {
        pvVar1 = &a->arg_orders;
        pvVar12 = &b->arg_orders;
        sVar11 = 0;
        do {
          pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar11);
          OVar2 = pvVar8->type;
          pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar12,sVar11);
          if (OVar2 != pvVar8->type) {
            return false;
          }
          pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar11);
          OVar3 = pvVar8->null_order;
          pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar12,sVar11);
          if (OVar3 != pvVar8->null_order) {
            return false;
          }
          pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar11);
          pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(&pvVar8->expression);
          pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar12,sVar11);
          pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(&pvVar8->expression);
          iVar7 = (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[10])(pPVar9,pPVar10);
          if ((char)iVar7 == '\0') {
            return false;
          }
          sVar11 = sVar11 + 1;
        } while (sVar11 < (ulong)((long)(a->arg_orders).
                                        super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                        .
                                        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(a->arg_orders).
                                        super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                        .
                                        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      bVar6 = ParsedExpression::ListEquals(&a->partitions,&b->partitions);
      if (bVar6) {
        pOVar4 = (a->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                 .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pOVar5 = (a->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                 .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((long)pOVar5 - (long)pOVar4 ==
            (long)(b->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(b->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          if (pOVar5 != pOVar4) {
            pvVar1 = &a->orders;
            pvVar12 = &b->orders;
            sVar11 = 0;
            do {
              pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar11);
              OVar2 = pvVar8->type;
              pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar12,sVar11);
              if (OVar2 != pvVar8->type) {
                return false;
              }
              pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar11);
              OVar3 = pvVar8->null_order;
              pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar12,sVar11);
              if (OVar3 != pvVar8->null_order) {
                return false;
              }
              pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar11);
              pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->(&pvVar8->expression);
              pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](pvVar12,sVar11);
              pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator*(&pvVar8->expression);
              iVar7 = (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[10])(pPVar9,pPVar10);
              if ((char)iVar7 == '\0') {
                return false;
              }
              sVar11 = sVar11 + 1;
            } while (sVar11 < (ulong)((long)(a->orders).
                                            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                            .
                                            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(a->orders).
                                            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                            .
                                            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          bVar6 = ParsedExpression::Equals(&a->filter_expr,&b->filter_expr);
          return bVar6;
        }
      }
    }
  }
  return false;
}

Assistant:

bool WindowExpression::Equal(const WindowExpression &a, const WindowExpression &b) {
	// check if the child expressions are equivalent
	if (a.ignore_nulls != b.ignore_nulls) {
		return false;
	}
	if (a.distinct != b.distinct) {
		return false;
	}
	if (!ParsedExpression::ListEquals(a.children, b.children)) {
		return false;
	}
	if (a.start != b.start || a.end != b.end) {
		return false;
	}
	if (a.exclude_clause != b.exclude_clause) {
		return false;
	}
	// check if the framing expressions are equivalent
	if (!ParsedExpression::Equals(a.start_expr, b.start_expr) || !ParsedExpression::Equals(a.end_expr, b.end_expr) ||
	    !ParsedExpression::Equals(a.offset_expr, b.offset_expr) ||
	    !ParsedExpression::Equals(a.default_expr, b.default_expr)) {
		return false;
	}

	// check if the argument orderings are equivalent
	if (a.arg_orders.size() != b.arg_orders.size()) {
		return false;
	}
	for (idx_t i = 0; i < a.arg_orders.size(); i++) {
		if (a.arg_orders[i].type != b.arg_orders[i].type) {
			return false;
		}
		if (a.arg_orders[i].null_order != b.arg_orders[i].null_order) {
			return false;
		}
		if (!a.arg_orders[i].expression->Equals(*b.arg_orders[i].expression)) {
			return false;
		}
	}

	// check if the partitions are equivalent
	if (!ParsedExpression::ListEquals(a.partitions, b.partitions)) {
		return false;
	}
	// check if the orderings are equivalent
	if (a.orders.size() != b.orders.size()) {
		return false;
	}
	for (idx_t i = 0; i < a.orders.size(); i++) {
		if (a.orders[i].type != b.orders[i].type) {
			return false;
		}
		if (a.orders[i].null_order != b.orders[i].null_order) {
			return false;
		}
		if (!a.orders[i].expression->Equals(*b.orders[i].expression)) {
			return false;
		}
	}
	// check if the filter clauses are equivalent
	if (!ParsedExpression::Equals(a.filter_expr, b.filter_expr)) {
		return false;
	}

	return true;
}